

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::Compute_Adtdt
          (ChFrameMoving<double> *this,ChMatrix33<double> *mA_dtdt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int local_214;
  double *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>_>_>
  local_1e8;
  undefined1 local_1a0 [16];
  double local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  double local_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  double local_d0;
  undefined8 local_c8;
  double local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [32];
  undefined1 local_90 [16];
  double local_80;
  double local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  double local_50;
  undefined8 local_48;
  double local_40;
  undefined8 local_38;
  double local_30;
  double local_28;
  
  local_80 = (this->coord_dtdt).rot.m_data[1];
  local_210 = &local_80;
  local_208 = local_e0;
  local_200 = local_140;
  local_1f8 = local_1a0;
  local_78 = (this->coord_dtdt).rot.m_data[0];
  local_40 = (this->coord_dtdt).rot.m_data[3];
  local_60 = *(undefined1 (*) [16])((this->coord_dtdt).rot.m_data + 2);
  auVar9._0_8_ = -local_40;
  auVar9._8_8_ = -local_40;
  local_70 = vunpcklpd_avx(auVar9,local_60);
  auVar10._0_8_ = -local_80;
  auVar10._8_8_ = -local_80;
  auVar5._0_8_ = local_60._0_8_ ^ 0x8000000000000000;
  auVar5._8_8_ = local_60._8_8_ ^ 0x8000000000000000;
  local_48 = vmovlpd_avx(auVar10);
  local_38 = vmovlpd_avx(auVar5);
  auVar5 = *(undefined1 (*) [16])(this->super_ChFrame<double>).coord.rot.m_data;
  local_c0 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  local_d0 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  local_b0 = vpermilpd_avx(*(undefined1 (*) [32])(this->super_ChFrame<double>).coord.rot.m_data,6);
  local_e0 = vshufpd_avx(auVar5,auVar5,1);
  auVar2._0_8_ = -local_c0;
  auVar2._8_8_ = -local_c0;
  local_c8 = vmovlpd_avx(auVar2);
  auVar3._0_8_ = -local_d0;
  auVar3._8_8_ = 0x8000000000000000;
  local_b8 = vmovlpd_avx(auVar3);
  auVar4._0_8_ = -dVar1;
  auVar4._8_8_ = -dVar1;
  local_90 = vunpcklpd_avx(auVar4,auVar5);
  local_190 = (this->coord_dt).rot.m_data[3];
  local_120 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  auVar6._0_8_ = -local_190;
  auVar6._8_8_ = 0x8000000000000000;
  local_130 = vunpcklpd_avx(auVar6,local_120);
  auVar8._0_8_ = local_120._0_8_ ^ 0x8000000000000000;
  auVar8._8_8_ = local_120._8_8_ ^ 0x8000000000000000;
  local_188 = vunpcklpd_avx(auVar8,local_120);
  local_f8 = vmovlpd_avx(auVar8);
  local_160 = vshufpd_avx(local_120,local_120,1);
  local_178 = vmovlpd_avx(auVar6);
  local_170 = *(undefined1 (*) [16])(this->coord_dt).rot.m_data;
  local_214 = 2;
  local_1a0 = vshufpd_avx(local_170,local_170,1);
  auVar7._0_8_ = -(this->coord_dt).rot.m_data[1];
  auVar7._8_8_ = 0x8000000000000000;
  local_150 = vunpcklpd_avx(auVar7,local_170);
  local_110 = vunpcklpd_avx(local_170,auVar7);
  local_140 = local_1a0;
  local_100 = local_190;
  local_f0 = local_1a0;
  local_50 = local_78;
  local_30 = local_80;
  local_28 = local_78;
  Eigen::operator*(&local_1e8,&local_214,(StorageBaseType *)&local_210);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,4,1,3,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>,0>const,Eigen::Product<Eigen::Matrix<double,3,4,1,3,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>,0>const>const>>
            (&mA_dtdt->super_Matrix<double,_3,_3,_1,_3,_3>,&local_1e8);
  return;
}

Assistant:

void Compute_Adtdt(ChMatrix33<Real>& mA_dtdt) {
        //  [A_dtdt]=2[Fp(q_dtdt)][Fm(q)]'+2[Fp(q_dt)][Fm(q_dt)]'
        ChFpMatrix34<> Fpdtdt(coord_dtdt.rot);
        ChFmMatrix34<> Fm(this->coord.rot);
        ChFpMatrix34<> Fpdt(coord_dt.rot);
        ChFmMatrix34<> Fmdt(coord_dt.rot);
        mA_dtdt = 2 * (Fpdtdt * Fm.transpose() + Fpdt * Fmdt.transpose());
    }